

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDesc *Member)

{
  pointer pSVar1;
  char *pcVar2;
  SHADER_CODE_BASIC_TYPE SVar3;
  Uint8 UVar4;
  Uint8 UVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  
  (this->super_ShaderCodeVariableDesc).pMembers = Member->pMembers;
  pcVar11 = Member->Name;
  pcVar2 = Member->TypeName;
  SVar3 = Member->BasicType;
  UVar4 = Member->NumRows;
  UVar5 = Member->NumColumns;
  UVar6 = Member->Offset;
  UVar7 = Member->ArraySize;
  UVar8 = Member->NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = Member->Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar3;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar4;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar5;
  (this->super_ShaderCodeVariableDesc).Offset = UVar6;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar7;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar8;
  (this->super_ShaderCodeVariableDesc).Name = pcVar11;
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar2;
  pcVar11 = Member->Name;
  if (pcVar11 == (char *)0x0) {
    pcVar11 = "";
  }
  (this->NameCopy)._M_dataplus._M_p = (pointer)&(this->NameCopy).field_2;
  sVar9 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->NameCopy,pcVar11,pcVar11 + sVar9)
  ;
  pcVar11 = "";
  if (Member->TypeName != (char *)0x0) {
    pcVar11 = Member->TypeName;
  }
  (this->TypeNameCopy)._M_dataplus._M_p = (pointer)&(this->TypeNameCopy).field_2;
  sVar9 = strlen(pcVar11);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->TypeNameCopy,pcVar11,pcVar11 + sVar9);
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::reserve(&this->Members,(ulong)Member->NumMembers);
  if (Member->NumMembers != 0) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      std::
      vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>::
      emplace_back<Diligent::ShaderCodeVariableDesc_const&>
                ((vector<Diligent::ShaderCodeVariableDescX,std::allocator<Diligent::ShaderCodeVariableDescX>>
                  *)&this->Members,
                 (ShaderCodeVariableDesc *)((long)&Member->pMembers->Name + lVar10));
      pSVar1 = (this->Members).
               super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->super_ShaderCodeVariableDesc).NumMembers =
           (Uint32)((ulong)((long)(this->Members).
                                  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 7);
      (this->super_ShaderCodeVariableDesc).pMembers = &pSVar1->super_ShaderCodeVariableDesc;
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar12 < Member->NumMembers);
  }
  return;
}

Assistant:

ShaderCodeVariableDescX(const ShaderCodeVariableDesc& Member) noexcept :
        ShaderCodeVariableDesc{Member},
        // clang-format off
        NameCopy    {Member.Name     != nullptr ? Member.Name     : ""},
        TypeNameCopy{Member.TypeName != nullptr ? Member.TypeName : ""}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();

        Members.reserve(Member.NumMembers);
        for (Uint32 i = 0; i < Member.NumMembers; ++i)
            AddMember(Member.pMembers[i]);
    }